

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blur.h
# Opt level: O2

void __thiscall BlurExample::initialize(BlurExample *this)

{
  Texture *pTVar1;
  RootWindow *pRVar2;
  Node *this_00;
  Texture *pTVar3;
  uint *puVar4;
  TransformNode *this_01;
  Node *pNVar5;
  TextureNode *child;
  long lVar6;
  float *pfVar7;
  undefined1 *puVar8;
  float *pfVar9;
  byte bVar10;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  rect2d geometry;
  rect2d geometry_00;
  rect2d geometry_01;
  rect2d geometry_02;
  rect2d geometry_03;
  rect2d geometry_04;
  rect2d geometry_05;
  vec4 color;
  vec4 color_00;
  vec4 color_01;
  vec4 color_02;
  vec4 color_03;
  mat4 in_stack_fffffffffffffe68;
  float local_148 [6];
  undefined8 local_130;
  undefined8 uStack_128;
  undefined4 local_120;
  undefined8 local_11c;
  undefined8 uStack_114;
  undefined8 local_10c;
  undefined1 local_104 [8];
  mat4 matrix;
  undefined4 local_b8;
  float local_b4;
  undefined8 local_b0;
  undefined4 local_a8;
  float local_a4;
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_94;
  undefined8 uStack_8c;
  undefined8 local_84;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  Node *local_50;
  BlurNode *blurNode;
  float fStack_40;
  float fStack_3c;
  undefined1 local_30 [8];
  shared_ptr<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>_>
  a;
  
  bVar10 = 0;
  pTVar3 = ImageUtils::load((((this->super_Example).m_window)->super_StandardSurface).m_renderer.
                            _M_t.
                            super___uniq_ptr_impl<rengine::Renderer,_std::default_delete<rengine::Renderer>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_rengine::Renderer_*,_std::default_delete<rengine::Renderer>_>
                            .super__Head_base<0UL,_rengine::Renderer_*,_false>._M_head_impl,
                            "walker.png");
  pTVar1 = (this->m_texture)._M_t.
           super___uniq_ptr_impl<rengine::Texture,_std::default_delete<rengine::Texture>_>._M_t.
           super__Tuple_impl<0UL,_rengine::Texture_*,_std::default_delete<rengine::Texture>_>.
           super__Head_base<0UL,_rengine::Texture_*,_false>._M_head_impl;
  (this->m_texture)._M_t.
  super___uniq_ptr_impl<rengine::Texture,_std::default_delete<rengine::Texture>_>._M_t.
  super__Tuple_impl<0UL,_rengine::Texture_*,_std::default_delete<rengine::Texture>_>.
  super__Head_base<0UL,_rengine::Texture_*,_false>._M_head_impl = pTVar3;
  if (pTVar1 != (Texture *)0x0) {
    (*pTVar1->_vptr_Texture[1])();
  }
  (*((((this->super_Example).m_window)->super_StandardSurface).super_Surface.m_impl)->
    _vptr_SurfaceBackendImpl[6])();
  blurNode._0_4_ = extraout_XMM0_Da;
  blurNode._4_4_ = extraout_XMM0_Db;
  fStack_40 = (float)extraout_XMM0_Dc;
  fStack_3c = (float)extraout_XMM0_Dd;
  local_50 = &rengine::BlurNode::create()->super_Node;
  *(undefined4 *)&local_50->field_0x34 = 0x25;
  std::
  make_shared<rengine::Animation<rengine::BlurNode,unsigned_int,&rengine::BlurNode::setRadius,&rengine::AnimationCurves::smooth>,rengine::BlurNode*&>
            ((BlurNode **)local_30);
  rengine::AbstractAnimation::setDuration((AbstractAnimation *)local_30,2.0);
  rengine::AbstractAnimation::setDirection((AbstractAnimation *)local_30,Alternate);
  rengine::AbstractAnimation::setIterations((AbstractAnimation *)local_30,-1);
  puVar4 = rengine::
           Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>
           ::newKeyFrame((Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>
                          *)local_30,0.0);
  *puVar4 = 0;
  puVar4 = rengine::
           Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>
           ::newKeyFrame((Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>
                          *)local_30,1.0);
  *puVar4 = 100;
  pRVar2 = (this->super_Example).m_window;
  std::__shared_ptr<rengine::AbstractAnimation,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<rengine::Animation<rengine::BlurNode,unsigned_int,&rengine::BlurNode::setRadius,&rengine::AnimationCurves::smooth>,void>
            ((__shared_ptr<rengine::AbstractAnimation,(__gnu_cxx::_Lock_policy)2> *)(matrix.m + 0xf)
             ,(__shared_ptr<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
               *)local_30);
  rengine::AnimationManager::start
            (&(pRVar2->super_StandardSurface).m_animationManager,
             (shared_ptr<rengine::AbstractAnimation> *)(matrix.m + 0xf),0.0);
  local_68 = blurNode._0_4_ * 0.5;
  fStack_64 = blurNode._4_4_;
  uStack_60 = fStack_40;
  uStack_5c = fStack_3c;
  blurNode._0_4_ = blurNode._4_4_ * 0.5;
  fStack_40 = blurNode._4_4_;
  fStack_3c = blurNode._4_4_;
  local_78 = blurNode._0_4_;
  if (local_68 <= blurNode._0_4_) {
    local_78 = local_68;
  }
  fStack_74 = blurNode._4_4_;
  fStack_70 = blurNode._4_4_;
  fStack_6c = blurNode._4_4_;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff48);
  std::__shared_ptr<rengine::AbstractAnimation,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<rengine::AbstractAnimation,(__gnu_cxx::_Lock_policy)2> *)
             &this->m_animation,
             (__shared_ptr<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
              *)local_30);
  matrix.m[0xf] = 1.0;
  matrix.type = 0;
  local_b8 = 0;
  local_b4 = local_68;
  local_b0 = 0x3f80000000000000;
  local_a8 = 0;
  local_a4 = blurNode._0_4_;
  local_a0 = 0;
  local_98 = 0x3f800000;
  local_94 = 0;
  uStack_8c = 0;
  local_84 = 0x13f800000;
  local_148[0] = local_78;
  local_148[1] = 0.0;
  local_148[2] = 0.0;
  local_148[3] = 0.0;
  local_148[4] = 0.0;
  local_148[5] = local_78;
  local_130 = 0;
  uStack_128 = 0;
  local_120 = 0x3f800000;
  local_11c = 0;
  uStack_114 = 0;
  local_10c = 0x23f800000;
  pfVar7 = local_148;
  puVar8 = &stack0xfffffffffffffe68;
  for (lVar6 = 0x44; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar8 = *(undefined1 *)pfVar7;
    pfVar7 = (float *)((long)pfVar7 + (ulong)bVar10 * -2 + 1);
    puVar8 = puVar8 + (ulong)bVar10 * -2 + 1;
  }
  rengine::mat4::operator*((mat4 *)local_104,(mat4 *)(matrix.m + 0xf),in_stack_fffffffffffffe68);
  pfVar7 = (float *)local_104;
  pfVar9 = matrix.m + 0xf;
  for (lVar6 = 0x11; lVar6 != 0; lVar6 = lVar6 + -1) {
    *pfVar9 = *pfVar7;
    pfVar7 = pfVar7 + (ulong)bVar10 * -2 + 1;
    pfVar9 = pfVar9 + (ulong)bVar10 * -2 + 1;
  }
  this_01 = rengine::TransformNode::create();
  this_00 = local_50;
  pfVar7 = matrix.m + 0xf;
  pfVar9 = (float *)&(this_01->super_Node).field_0x34;
  for (lVar6 = 0x11; lVar6 != 0; lVar6 = lVar6 + -1) {
    *pfVar9 = *pfVar7;
    pfVar7 = pfVar7 + (ulong)bVar10 * -2 + 1;
    pfVar9 = pfVar9 + (ulong)bVar10 * -2 + 1;
  }
  this_01->m_projectionDepth = 0.0;
  geometry.br.x = 0.45000002;
  geometry.br.y = -0.19999999;
  geometry.tl.x = 0.15;
  geometry.tl.y = -0.5;
  color.z = 0.0;
  color.w = 1.0;
  color.x = 1.0;
  color.y = 0.0;
  pNVar5 = (Node *)rengine::RectangleNode::create(geometry,color);
  rengine::Node::append(this_00,pNVar5);
  geometry_00.br.x = 0.45000002;
  geometry_00.br.y = 0.15;
  geometry_00.tl.x = 0.15;
  geometry_00.tl.y = -0.15;
  color_00.z = 0.0;
  color_00.w = 1.0;
  color_00.x = 0.0;
  color_00.y = 1.0;
  pNVar5 = (Node *)rengine::RectangleNode::create(geometry_00,color_00);
  rengine::Node::append(this_00,pNVar5);
  geometry_01.br.x = 0.45000002;
  geometry_01.br.y = 0.5;
  geometry_01.tl.x = 0.15;
  geometry_01.tl.y = 0.2;
  pNVar5 = (Node *)rengine::RectangleNode::create
                             (geometry_01,(vec4)(ZEXT816(0x3f8000003f800000) << 0x40));
  rengine::Node::append(this_00,pNVar5);
  geometry_02.br.x = 0.8;
  geometry_02.br.y = -0.19999999;
  geometry_02.tl.x = 0.5;
  geometry_02.tl.y = -0.5;
  color_01.z = 0.0;
  color_01.w = 1.0;
  color_01.x = 1.0;
  color_01.y = 1.0;
  pNVar5 = (Node *)rengine::RectangleNode::create(geometry_02,color_01);
  rengine::Node::append(this_00,pNVar5);
  geometry_03.br.x = 0.8;
  geometry_03.br.y = 0.15;
  geometry_03.tl.x = 0.5;
  geometry_03.tl.y = -0.15;
  color_02.z = 1.0;
  color_02.w = 1.0;
  color_02.x = 0.0;
  color_02.y = 1.0;
  pNVar5 = (Node *)rengine::RectangleNode::create(geometry_03,color_02);
  rengine::Node::append(this_00,pNVar5);
  geometry_04.br.x = 0.8;
  geometry_04.br.y = 0.5;
  geometry_04.tl.x = 0.5;
  geometry_04.tl.y = 0.2;
  color_03.z = 1.0;
  color_03.w = 1.0;
  color_03.x = 1.0;
  color_03.y = 0.0;
  pNVar5 = (Node *)rengine::RectangleNode::create(geometry_04,color_03);
  rengine::Node::append(this_00,pNVar5);
  geometry_05.br.x = -0.15000004;
  geometry_05.br.y = 0.5;
  geometry_05.tl.x = -0.8;
  geometry_05.tl.y = -0.5;
  child = rengine::TextureNode::create
                    ((TextureNode *)
                     (this->m_texture)._M_t.
                     super___uniq_ptr_impl<rengine::Texture,_std::default_delete<rengine::Texture>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_rengine::Texture_*,_std::default_delete<rengine::Texture>_>
                     .super__Head_base<0UL,_rengine::Texture_*,_false>._M_head_impl,geometry_05,
                     (Texture *)pNVar5);
  rengine::Node::append(this_00,(Node *)child);
  rengine::Node::append(&this_01->super_Node,this_00);
  rengine::Node::append((Node *)this,&this_01->super_Node);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&a);
  return;
}

Assistant:

void initialize() override {
        m_texture.reset(ImageUtils::load(renderer(), "walker.png"));

        vec2 s = size();
        float w2 = s.x / 2.0f;
        float h2 = s.y / 2.0f;
        float s2 = std::min(w2, h2);

        BlurNode *blurNode = BlurNode::create(37);

        auto a = make_shared<Animation_BlurNode_radius>(blurNode);
        a->setDuration(2);
        a->setDirection(AbstractAnimation::Alternate);
        a->setIterations(-1);
        a->newKeyFrame(0) = 0;
        a->newKeyFrame(1) = 100;

        animationManager()->start(a);
        m_animation = a;

        mat4 matrix = mat4::translate2D(w2, h2)
                      * mat4::scale2D(s2, s2);
        Node *root = &(*TransformNode::create(matrix)
                    << &(*blurNode
                       << RectangleNode::create(rect2d::fromXywh(0.15, -0.5,  0.3, 0.3), vec4(1, 0, 0, 1))
                       << RectangleNode::create(rect2d::fromXywh(0.15, -0.15, 0.3, 0.3), vec4(0, 1, 0, 1))
                       << RectangleNode::create(rect2d::fromXywh(0.15,  0.2,  0.3, 0.3), vec4(0, 0, 1, 1))
                       << RectangleNode::create(rect2d::fromXywh( 0.5, -0.5,  0.3, 0.3), vec4(1, 1, 0, 1))
                       << RectangleNode::create(rect2d::fromXywh( 0.5, -0.15, 0.3, 0.3), vec4(0, 1, 1, 1))
                       << RectangleNode::create(rect2d::fromXywh( 0.5,  0.2,  0.3, 0.3), vec4(1, 0, 1, 1))
                       << TextureNode::create(rect2d::fromXywh(-0.8, -0.5, 0.65, 1.0), m_texture.get())
                     )
                );
        append(root);
    }